

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::Decode
          (TrackJamTargetIdentifier *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  TrackJamTargetIdentifier *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 8) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>
                     (local_18,&(this->super_EntityIdentifier).super_SimulationIdentifier.
                                m_ui16SiteID);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_EntityIdentifier).super_SimulationIdentifier.
                              m_ui16ApplicationID);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,(unsigned_short *)
                             &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xc);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xe);
  KDataStream::operator>>
            (pKVar2,&(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xf);
  return;
}

Assistant:

void TrackJamTargetIdentifier::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < TRACK_JAM_TARGET_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16SiteID
           >> m_ui16ApplicationID
           >> m_ui16EntityID
           >> m_ui8EmitterID
           >> m_ui8BeamID;
}